

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

void __thiscall opts::BasicOption::~BasicOption(BasicOption *this)

{
  this->_vptr_BasicOption = (_func_int **)&PTR__BasicOption_0014f0b8;
  std::__cxx11::string::~string((string *)&this->help);
  std::__cxx11::string::~string((string *)&this->t);
  std::__cxx11::string::~string((string *)&this->d);
  std::__cxx11::string::~string((string *)&this->l);
  return;
}

Assistant:

virtual         ~BasicOption()                                                          {}